

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O1

char * util::wtf8_find_end(char *begin,char *end)

{
  char *pcVar1;
  char *i;
  
  if ((end == begin) || (pcVar1 = end + -1, -1 < end[-1])) {
    pcVar1 = end;
  }
  return pcVar1;
}

Assistant:

const char * wtf8_find_end(const char * begin, const char * end) {
	
	const char * i = end;
	while(i != begin && is_utf8_continuation_byte(boost::uint8_t(*(i - 1)))) {
		i--;
	}
	
	if(i != begin) {
		unicode_char chr = boost::uint8_t(*(i - 1));
		size_t expected = 0;
		if(chr & (1 << 7)) {
			expected++;
			if(chr & (1 << (5 + 6))) {
				expected++;
				if(chr & (1 << (4 + 6 + 6))) {
					expected++;
				}
			}
		}
		if(expected > size_t(end - i)) {
			return i - 1;
		}
	}
	
	return end;
}